

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O2

void __thiscall cfd::core::ScriptWitness::ScriptWitness(ScriptWitness *this,ScriptWitness *param_1)

{
  this->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_005ba128;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&this->witness_stack_,&param_1->witness_stack_);
  return;
}

Assistant:

class CFD_CORE_EXPORT ScriptWitness {
 public:
  /**
   * @brief constructor.
   */
  ScriptWitness() : witness_stack_() {
    // do nothing
  }
  /**
   * @brief destructor.
   */
  virtual ~ScriptWitness() {
    // do nothing
  }
  /**
   * @brief Get the witness stack.
   * @return witness stack
   */
  const std::vector<ByteData> GetWitness() const;
  /**
   * @brief Get the number of witness stacks.
   * @return number of witness stacks.
   */
  uint32_t GetWitnessNum() const;
  /**
   * @brief Add to witness stack.
   * @param[in] data      byte array.
   */
  void AddWitnessStack(const ByteData& data);
  /**
   * @brief Update the specified index of the witness stack.
   * @param[in] index     index
   * @param[in] data      byte array.
   */
  void SetWitnessStack(uint32_t index, const ByteData& data);
  /**
   * @brief Check if the data is empty.
   * @retval true   empty.
   * @retval false  exist.
   * @deprecated replace to IsEmpty .
   */
  bool Empty() const;
  /**
   * @brief Check if the data is empty.
   * @retval true   empty.
   * @retval false  exist.
   */
  bool IsEmpty() const;

  /**
   * @brief Serialize witness stack information.
   * @return serialize data
   */
  ByteData Serialize() const;

 private:
  std::vector<ByteData> witness_stack_;  ///< witness stack.
}